

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conversion.cpp
# Opt level: O2

int DIS::Convert::MakeArticulationParameterType(int typeclass,int typemetric)

{
  return typeclass * 0x20 + (typemetric & 0x1fU);
}

Assistant:

int Convert::MakeArticulationParameterType(int typeclass, int typemetric)
{
   // enforce a ceiling on typemetric
   typemetric = typemetric & ARTICULATION_PARAMETER_TYPE_METRIC_MASK;

   // shift the typeclass bits to the left by the precision amount of typemetric
   // and then add the typemetric bits
   return( (typeclass << ARTICULATION_PARAMETER_TYPE_METRIC_NUMBER_OF_BITS)
          + typemetric );
}